

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# includes.hpp
# Opt level: O2

double cvs_rk::HK<cvs_rk::mod_int<9223372036854775783ul>>
                 (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  *S)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulint k;
  long lVar3;
  long lVar4;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *in_RDX;
  long lVar5;
  ulint k_1;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM2 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> m_k;
  double local_48;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  get_counts_mk<cvs_rk::mod_int<9223372036854775783ul>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,(cvs_rk *)S,in_RDX);
  dVar6 = 0.0;
  lVar3 = 0;
  lVar5 = (long)local_30._M_impl.super__Vector_impl_data._M_finish -
          (long)local_30._M_impl.super__Vector_impl_data._M_start >> 3;
  while (lVar5 != lVar3) {
    lVar4 = local_30._M_impl.super__Vector_impl_data._M_start[lVar3] * lVar3;
    lVar3 = lVar3 + 1;
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,lVar4);
    dVar6 = dVar6 + auVar1._0_8_;
  }
  local_48 = 0.0;
  for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
    if (local_30._M_impl.super__Vector_impl_data._M_start[lVar3] != 0) {
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,local_30._M_impl.super__Vector_impl_data._M_start[lVar3] *
                                          lVar3);
      dVar7 = log(auVar2._0_8_ * (1.0 / dVar6));
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_48;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = 1.0 / dVar6;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar7 * auVar2._0_8_;
      auVar1 = vfnmadd231sd_fma(auVar9,auVar8,auVar1);
      local_48 = auVar1._0_8_;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  return local_48;
}

Assistant:

double HK(vector<T> S){

	auto m_k = get_counts_mk<T>(S);

	double Hk = 0;
	double M = 0;

	for(ulint k=0;k<m_k.size();++k){

		M += k*m_k[k];

	}

	for(ulint k=0;k<m_k.size();++k){

		if(m_k[k]>0) Hk -= (double(k*m_k[k])/M) * log(double(k*m_k[k])/M);

	}

	return Hk;

}